

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

compressed_lower_distance_matrix * read_file(istream *input_stream,file_format format)

{
  logic_error *this;
  undefined4 in_EDX;
  compressed_lower_distance_matrix *in_RDI;
  istream *in_stack_00000008;
  istream *in_stack_000001b8;
  istream *in_stack_00000248;
  
  switch(in_EDX) {
  case 0:
    read_lower_distance_matrix(in_stack_00000008);
    break;
  case 1:
    read_upper_distance_matrix(input_stream);
    break;
  case 2:
    read_distance_matrix(in_stack_000001b8);
    break;
  case 3:
    read_point_cloud(in_stack_00000248);
    break;
  case 4:
    read_dipha(in_stack_00000008);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Format not known.");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return in_RDI;
}

Assistant:

compressed_lower_distance_matrix read_file(std::istream& input_stream, file_format format) {
	switch (format) {
	case LOWER_DISTANCE_MATRIX:
		return read_lower_distance_matrix(input_stream);
	case UPPER_DISTANCE_MATRIX:
		return read_upper_distance_matrix(input_stream);
	case DISTANCE_MATRIX:
		return read_distance_matrix(input_stream);
	case POINT_CLOUD:
		return read_point_cloud(input_stream);
	case DIPHA:
		return read_dipha(input_stream);
	default:
		throw std::logic_error("Format not known.");
	}
}